

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

int __thiscall
gl4cts::ShadingLanguage420PackTests::init(ShadingLanguage420PackTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  BindingUniformBlocksTest *this_00;
  BindingUniformBlockArrayTest *this_01;
  BindingSamplersTest *this_02;
  BindingSamplerArrayTest *this_03;
  BindingImagesTest *this_04;
  BindingImageArrayTest *this_05;
  
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_sampler_single",
             "Test verifies sampler binding");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindingSamplerSingleTest_020dbd68;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = (size_type)pCVar1;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_image_single",
             "Test verifies single binding of image used in multiple stages");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindingImageSingleTest_020dc090;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = (size_type)pCVar1;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"utf8_characters",
             "UTF8 character used in comment or preprocessor");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db1e0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"utf8_in_source",
             "UTF8 characters used in shader source");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db270;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"qualifier_order",
             "Test verifies that valid permutation of input and output qalifiers are accepted");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__QualifierOrderTest_020db550;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"qualifier_order_block",
             "Verifies that qualifiers of members of input block can be arranged in any order");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__QualifierOrderBlockTest_020db5e0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar2,pCVar1->m_testCtx,"line_continuation","desc");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db058;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"line_numbering",
             "Verify if line numbering is correct after line continuation");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db0e8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"implicit_conversions",
             "Verifies that implicit conversions are allowed");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__ImplicitConversionsValidTest_020db2e0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"implicit_conversions_invalid",
             "Verifies that implicit conversions from uint to int are forbidden");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db370;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"const_dynamic_value",
             "Test if constants can be initialized with dynamic values");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db3e0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"const_assignment",
             "Verifies that constants cannot be overwritten");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db470;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"const_dynamic_value_as_const_expr",
             "Verifies that dynamic constants cannot be used as constant foldable expressions");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db4e0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"qualifier_order_uniform",
             "Test verifies that all valid permutation of input qalifiers are accepted");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__QualifierOrderUniformTest_020db670;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"qualifier_order_function_inout",
             "Verify order of qualifiers of inout function parameters");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__QualifierOrderFunctionInoutTest_020db700;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"qualifier_order_function_input",
             "Verify order of qualifiers of function input parameters");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__QualifierOrderFunctionInputTest_020db790;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"qualifier_order_function_output",
             "Verify order of qualifiers of output function parameters");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__QualifierOrderFunctionOutputTest_020db820;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"qualifier_override_layout",
             "Verifies overriding layout qualifiers");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020db8b0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_00 = (BindingUniformBlocksTest *)operator_new(200);
  GLSL420Pack::BindingUniformBlocksTest::BindingUniformBlocksTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_uniform_single_block",
             "Test verifies uniform block binding");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindingUniformSingleBlockTest_020db9d0;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = (size_type)pCVar1;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_01 = (BindingUniformBlockArrayTest *)operator_new(0x1d0);
  GLSL420Pack::BindingUniformBlockArrayTest::BindingUniformBlockArrayTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_uniform_default",
             "Test verifies default binding of uniform block");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dbaf0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_uniform_api_overirde",
             "Test verifies if binding can be overriden with API");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindingUniformAPIOverirdeTest_020dbb68;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = (size_type)pCVar1;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_uniform_global_block",
             "Test verifies that global uniform cannot be qualified with binding");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dbbf8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_uniform_invalid",
             "Test verifies invalid binding values");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dbc68;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_02 = (BindingSamplersTest *)operator_new(0xe8);
  GLSL420Pack::BindingSamplersTest::BindingSamplersTest
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (BindingSamplerArrayTest *)operator_new(0x128);
  GLSL420Pack::BindingSamplerArrayTest::BindingSamplerArrayTest
            (this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_sampler_default",
             "Test verifies default sampler binding");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dbe88;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_sampler_api_override",
             "Verifies that API can override sampler binding");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindingSamplerAPIOverrideTest_020dbf00;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = (size_type)pCVar1;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_sampler_invalid",
             "Test verifies invalid binding values");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dbf90;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_04 = (BindingImagesTest *)operator_new(0x118);
  GLSL420Pack::BindingImagesTest::BindingImagesTest(this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (BindingImageArrayTest *)operator_new(0x128);
  GLSL420Pack::BindingImageArrayTest::BindingImageArrayTest
            (this_05,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_image_default",
             "Test verifies default image binding");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dc1b0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_image_api_override",
             "Verifies that API can override image binding");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BindingImageAPIOverrideTest_020dc228;
  *(undefined4 *)&pTVar2[1].m_name._M_dataplus._M_p = 0;
  pTVar2[1].m_name._M_string_length = (size_type)pCVar1;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"binding_image_invalid",
             "Test verifies invalid binding values");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dc2b8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"initializer_list",
             "Test verifies initializer lists");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InitializerListTest_020dc328;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"initializer_list_negative",
             "Verifies invalid initializers");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__InitializerListNegativeTest_020dc3b8;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"length_of_vector_and_matrix",
             "Test verifies .length() for vectors and matrices");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__LengthOfVectorAndMatrixTest_020dc428;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"length_of_compute_result",
             "Test verifies .length() for results of computation");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dc4b8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"scalar_swizzlers",
             "Verifies that swizzlers can be used on scalars");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dc548;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"scalar_swizzlers_invalid",
             "Verifies if invalid use of swizzlers on scalars is reported as error");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dc5d8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"built_in_values",
             "Test verifies values of gl_Min/Max_ProgramTexelOffset");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dc648;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"built_in_assignment",
             "Test verifies that built in gl_Min/MaxProgramTexelOffset cannot be assigned");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0;
  *(undefined1 *)((long)&pTVar2[1].m_testCtx + 2) = 0;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020dc6d8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void ShadingLanguage420PackTests::init(void)
{
	addChild(new GLSL420Pack::BindingSamplerSingleTest(m_context));
	addChild(new GLSL420Pack::BindingImageSingleTest(m_context));
	addChild(new GLSL420Pack::UTF8CharactersTest(m_context));
	addChild(new GLSL420Pack::UTF8InSourceTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderBlockTest(m_context));
	addChild(new GLSL420Pack::LineContinuationTest(m_context));
	addChild(new GLSL420Pack::LineNumberingTest(m_context));
	addChild(new GLSL420Pack::ImplicitConversionsValidTest(m_context));
	addChild(new GLSL420Pack::ImplicitConversionsInvalidTest(m_context));
	addChild(new GLSL420Pack::ConstDynamicValueTest(m_context));
	addChild(new GLSL420Pack::ConstAssignmentTest(m_context));
	addChild(new GLSL420Pack::ConstDynamicValueAsConstExprTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderUniformTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderFunctionInoutTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderFunctionInputTest(m_context));
	addChild(new GLSL420Pack::QualifierOrderFunctionOutputTest(m_context));
	addChild(new GLSL420Pack::QualifierOverrideLayoutTest(m_context));
	addChild(new GLSL420Pack::BindingUniformBlocksTest(m_context));
	addChild(new GLSL420Pack::BindingUniformSingleBlockTest(m_context));
	addChild(new GLSL420Pack::BindingUniformBlockArrayTest(m_context));
	addChild(new GLSL420Pack::BindingUniformDefaultTest(m_context));
	addChild(new GLSL420Pack::BindingUniformAPIOverirdeTest(m_context));
	addChild(new GLSL420Pack::BindingUniformGlobalBlockTest(m_context));
	addChild(new GLSL420Pack::BindingUniformInvalidTest(m_context));
	addChild(new GLSL420Pack::BindingSamplersTest(m_context));
	addChild(new GLSL420Pack::BindingSamplerArrayTest(m_context));
	addChild(new GLSL420Pack::BindingSamplerDefaultTest(m_context));
	addChild(new GLSL420Pack::BindingSamplerAPIOverrideTest(m_context));
	addChild(new GLSL420Pack::BindingSamplerInvalidTest(m_context));
	addChild(new GLSL420Pack::BindingImagesTest(m_context));
	addChild(new GLSL420Pack::BindingImageArrayTest(m_context));
	addChild(new GLSL420Pack::BindingImageDefaultTest(m_context));
	addChild(new GLSL420Pack::BindingImageAPIOverrideTest(m_context));
	addChild(new GLSL420Pack::BindingImageInvalidTest(m_context));
	addChild(new GLSL420Pack::InitializerListTest(m_context));
	addChild(new GLSL420Pack::InitializerListNegativeTest(m_context));
	addChild(new GLSL420Pack::LengthOfVectorAndMatrixTest(m_context));
	addChild(new GLSL420Pack::LengthOfComputeResultTest(m_context));
	addChild(new GLSL420Pack::ScalarSwizzlersTest(m_context));
	addChild(new GLSL420Pack::ScalarSwizzlersInvalidTest(m_context));
	addChild(new GLSL420Pack::BuiltInValuesTest(m_context));
	addChild(new GLSL420Pack::BuiltInAssignmentTest(m_context));
}